

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void generateCards(card *cards)

{
  unique_ptr<card,_std::default_delete<card>_> uVar1;
  __uniq_ptr_data<card,_std::default_delete<card>,_true,_true> this;
  uint i;
  ulong uVar2;
  uint __val;
  unique_ptr<card,_std::default_delete<card>_> temp;
  string local_d0 [5];
  
  this.super___uniq_ptr_impl<card,_std::default_delete<card>_>._M_t.
  super__Tuple_impl<0UL,_card_*,_std::default_delete<card>_>.super__Head_base<0UL,_card_*,_false>.
  _M_head_impl = (__uniq_ptr_impl<card,_std::default_delete<card>_>)operator_new(0x30);
  card::card((card *)this.super___uniq_ptr_impl<card,_std::default_delete<card>_>._M_t.
                     super__Tuple_impl<0UL,_card_*,_std::default_delete<card>_>.
                     super__Head_base<0UL,_card_*,_false>._M_head_impl);
  uVar2 = 0;
  temp._M_t.super___uniq_ptr_impl<card,_std::default_delete<card>_>._M_t.
  super__Tuple_impl<0UL,_card_*,_std::default_delete<card>_>.super__Head_base<0UL,_card_*,_false>.
  _M_head_impl = (__uniq_ptr_data<card,_std::default_delete<card>,_true,_true>)
                 (__uniq_ptr_data<card,_std::default_delete<card>,_true,_true>)
                 this.super___uniq_ptr_impl<card,_std::default_delete<card>_>._M_t.
                 super__Tuple_impl<0UL,_card_*,_std::default_delete<card>_>.
                 super__Head_base<0UL,_card_*,_false>._M_head_impl;
  while( true ) {
    uVar1._M_t.super___uniq_ptr_impl<card,_std::default_delete<card>_>._M_t.
    super__Tuple_impl<0UL,_card_*,_std::default_delete<card>_>.super__Head_base<0UL,_card_*,_false>.
    _M_head_impl = temp._M_t.super___uniq_ptr_impl<card,_std::default_delete<card>_>._M_t.
                   super__Tuple_impl<0UL,_card_*,_std::default_delete<card>_>.
                   super__Head_base<0UL,_card_*,_false>._M_head_impl;
    if (uVar2 == 0xb) {
      std::unique_ptr<card,_std::default_delete<card>_>::~unique_ptr(&temp);
      return;
    }
    if (6 < uVar2) break;
    __val = (int)uVar2 + 1;
    *(uint *)((long)temp._M_t.super___uniq_ptr_impl<card,_std::default_delete<card>_>._M_t.
                    super__Tuple_impl<0UL,_card_*,_std::default_delete<card>_>.
                    super__Head_base<0UL,_card_*,_false>._M_head_impl + 8) = __val;
    std::__cxx11::to_string(local_d0,__val);
    std::__cxx11::string::operator=
              ((string *)
               ((long)uVar1._M_t.super___uniq_ptr_impl<card,_std::default_delete<card>_>._M_t.
                      super__Tuple_impl<0UL,_card_*,_std::default_delete<card>_>.
                      super__Head_base<0UL,_card_*,_false>._M_head_impl + 0x10),(string *)local_d0);
    std::__cxx11::string::~string((string *)local_d0);
    card::operator=(cards,(card *)temp._M_t.super___uniq_ptr_impl<card,_std::default_delete<card>_>.
                                  _M_t.super__Tuple_impl<0UL,_card_*,_std::default_delete<card>_>.
                                  super__Head_base<0UL,_card_*,_false>._M_head_impl);
    uVar2 = uVar2 + 1;
    cards = cards + 1;
  }
  *(undefined4 *)
   ((long)temp._M_t.super___uniq_ptr_impl<card,_std::default_delete<card>_>._M_t.
          super__Tuple_impl<0UL,_card_*,_std::default_delete<card>_>.
          super__Head_base<0UL,_card_*,_false>._M_head_impl + 8) = 1;
  (*(code *)(&DAT_00107030 + *(int *)(&DAT_00107030 + (ulong)((int)uVar2 - 7) * 4)))();
  return;
}

Assistant:

void generateCards(card cards[]) {
    unique_ptr<card> temp(new card);
    for (unsigned int i = 0; i < CARD_TYPES; i++) {
        // numbered cards 1-7
        if (i < 7) {
            temp->setValue(i + 1);
            temp->setName(to_string(i + 1));
        }
        // special cards
        else {
            temp->setValue(1); // can be used to check if a card is numbered or special
            switch (i) {
                case 7:
                    temp->setName("bolt");
                    temp->setCardType(1);
                    break;
                case 8:
                    temp->setName("mirror");
                    temp->setCardType(2);
                    break;
                case 9:
                    temp->setName("blast");
                    temp->setCardType(3);
                    break;
                case 10:
                    temp->setName("force");
                    temp->setCardType(4);
                    break;
                default:
                    cout << "An error has occurred. " << "cards cannot be generated";
                    break;
            }
        }
        cards[i] = *temp;
    }
}